

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactWrench.cpp
# Opt level: O0

bool __thiscall
iDynTree::LinkContactWrenches::computeNetWrenches
          (LinkContactWrenches *this,LinkNetExternalWrenches *netWrenches)

{
  size_t sVar1;
  size_type sVar2;
  Position *pPVar3;
  Wrench *pWVar4;
  vector<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
  *in_RDI;
  Wrench link_wrench_due_to_contact;
  Transform link_H_contact;
  ContactWrench *contact;
  size_t c;
  size_t nrOfContacts;
  LinkIndex l;
  size_t nrOfLinks;
  Wrench *in_stack_fffffffffffffe68;
  SpatialVector<iDynTree::SpatialForceVector> *in_stack_fffffffffffffe70;
  Wrench local_150;
  Transform local_118 [16];
  size_t in_stack_fffffffffffffef8;
  LinkWrenches *in_stack_ffffffffffffff00;
  SpatialVector<iDynTree::SpatialForceVector> local_e0;
  Transform local_98 [96];
  ContactWrench *local_38;
  ulong local_30;
  ulong local_28;
  long local_20;
  size_t local_18;
  
  local_18 = LinkWrenches::getNrOfLinks((LinkWrenches *)0x39ed91);
  sVar1 = LinkWrenches::getNrOfLinks((LinkWrenches *)0x39eda6);
  sVar2 = std::
          vector<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
          ::size(in_RDI);
  if (sVar1 != sVar2) {
    std::
    vector<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
    ::size(in_RDI);
    LinkWrenches::resize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  for (local_20 = 0; local_20 < (long)local_18; local_20 = local_20 + 1) {
    LinkWrenches::operator()
              ((LinkWrenches *)in_stack_fffffffffffffe70,(LinkIndex)in_stack_fffffffffffffe68);
    SpatialVector<iDynTree::SpatialForceVector>::zero(in_stack_fffffffffffffe70);
    local_28 = getNrOfContactsForLink
                         ((LinkContactWrenches *)in_stack_fffffffffffffe70,
                          (LinkIndex)in_stack_fffffffffffffe68);
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      local_38 = contactWrench((LinkContactWrenches *)in_stack_fffffffffffffe70,
                               (LinkIndex)in_stack_fffffffffffffe68,0x39ee7f);
      in_stack_fffffffffffffe70 = &local_e0;
      iDynTree::Rotation::Identity();
      pPVar3 = ContactWrench::contactPoint(local_38);
      iDynTree::Transform::Transform(local_98,(Rotation *)in_stack_fffffffffffffe70,pPVar3);
      ContactWrench::contactWrench(local_38);
      iDynTree::Transform::operator*(local_118,(Wrench *)local_98);
      pWVar4 = LinkWrenches::operator()
                         ((LinkWrenches *)in_stack_fffffffffffffe70,
                          (LinkIndex)in_stack_fffffffffffffe68);
      iDynTree::Wrench::operator+(&local_150,pWVar4);
      in_stack_fffffffffffffe68 =
           LinkWrenches::operator()
                     ((LinkWrenches *)in_stack_fffffffffffffe70,(LinkIndex)in_stack_fffffffffffffe68
                     );
      iDynTree::Wrench::operator=(in_stack_fffffffffffffe68,&local_150);
      Wrench::~Wrench((Wrench *)0x39ef4c);
      Wrench::~Wrench((Wrench *)0x39ef59);
    }
  }
  return true;
}

Assistant:

bool LinkContactWrenches::computeNetWrenches(LinkNetExternalWrenches& netWrenches) const
{
    // Resize the output if necessary
    size_t nrOfLinks =  netWrenches.getNrOfLinks();
    if( netWrenches.getNrOfLinks() != m_linkContactWrenches.size() )
    {
        netWrenches.resize(m_linkContactWrenches.size());
    }

    for(LinkIndex l=0; l < static_cast<LinkIndex>(nrOfLinks); l++)
    {
        netWrenches(l).zero();

        // sum all the contact wrenches
        size_t nrOfContacts = this->getNrOfContactsForLink(l);
        for(size_t c=0; c < nrOfContacts; c++)
        {
            // Each contact wrench is expressed with respect to the contact point
            // and with the orientation of the link frame, so we need to translate it
            // to the link frame
            const ContactWrench & contact = this->contactWrench(l,c);

            Transform link_H_contact(Rotation::Identity(),contact.contactPoint());

            Wrench link_wrench_due_to_contact = link_H_contact*contact.contactWrench();

            netWrenches(l) = netWrenches(l) + link_wrench_due_to_contact;
        }
    }

    return true;
}